

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

int per_test_timeout_value(void)

{
  int iVar1;
  char *__nptr;
  int timeout_value;
  char *timeout_string;
  
  iVar1 = per_test_timeout_defined();
  if (iVar1 == 0) {
    die("attempt to fetch undefined value for %s\n",CGREEN_PER_TEST_TIMEOUT_ENVIRONMENT_VARIABLE);
  }
  __nptr = getenv(CGREEN_PER_TEST_TIMEOUT_ENVIRONMENT_VARIABLE);
  iVar1 = atoi(__nptr);
  return iVar1;
}

Assistant:

static int per_test_timeout_value(void)
{
    char *timeout_string;
    int timeout_value;

    if (!per_test_timeout_defined())
    {
        die("attempt to fetch undefined value for %s\n", CGREEN_PER_TEST_TIMEOUT_ENVIRONMENT_VARIABLE);
    }

    timeout_string = getenv(CGREEN_PER_TEST_TIMEOUT_ENVIRONMENT_VARIABLE);
    timeout_value = atoi(timeout_string);

    return timeout_value;
}